

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearActiveID(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  bVar2 = GImGui->ActiveId != 0;
  GImGui->ActiveIdIsJustActivated = bVar2;
  if (bVar2) {
    pIVar1->ActiveIdTimer = 0.0;
  }
  pIVar1->ActiveId = 0;
  pIVar1->ActiveIdAllowNavDirFlags = 0;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
        g.ActiveIdTimer = 0.0f;
    g.ActiveId = id;
    g.ActiveIdAllowNavDirFlags = 0;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdWindow = window;
    if (id)
    {
        g.ActiveIdIsAlive = true;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavInputId == id || g.NavJustTabbedId == id || g.NavJustMovedToId == id) ? ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }
}